

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

void runpstr(runcxdef *ctx,char *str,int len,int sav)

{
  uint siz;
  runsdef *prVar1;
  uchar *puVar2;
  uint16_t tmp;
  
  siz = len + 2;
  if ((uint)(*(int *)&ctx->runcxhtop - *(int *)&ctx->runcxhp) <= siz) {
    runhcmp(ctx,siz,sav,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
  }
  *(short *)ctx->runcxhp = (short)siz;
  memcpy(ctx->runcxhp + 2,str,(long)len);
  prVar1 = ctx->runcxsp;
  puVar2 = ctx->runcxhp;
  ctx->runcxhp = puVar2 + (int)siz;
  prVar1->runstyp = '\x03';
  (prVar1->runsv).runsvstr = puVar2;
  ctx->runcxsp = ctx->runcxsp + 1;
  return;
}

Assistant:

void runpstr(runcxdef *ctx, char *str, int len, int sav)
{
    runsdef val;
    
    /* allocate space and set up new string */
    runhres(ctx, len+2, sav);
    oswp2(ctx->runcxhp, len+2);
    memcpy(ctx->runcxhp+2, str, (size_t)len);

    /* push return value */
    val.runsv.runsvstr = ctx->runcxhp;
    val.runstyp = DAT_SSTRING;
    ctx->runcxhp += len + 2;
    runrepush(ctx, &val);
}